

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_find_string_in_file(char *filename,char *string,int stringlen)

{
  int __fd;
  ssize_t sVar1;
  uint local_bc;
  int local_b8;
  int hit;
  int n;
  int pos;
  int match;
  int fd;
  char buf [128];
  int stringlen_local;
  char *string_local;
  char *filename_local;
  
  n = 0;
  hit = 0;
  local_b8 = 0;
  buf._124_4_ = stringlen;
  __fd = lws_open(filename,0);
  if (__fd < 0) {
    _lws_log(1,"can\'t open auth file: %s\n",filename);
    return 0;
  }
  do {
    if (hit == local_b8) {
      sVar1 = read(__fd,&match,0x80);
      local_b8 = (int)sVar1;
      if (local_b8 < 1) {
        local_bc = (uint)(n == buf._124_4_);
        goto LAB_00152ff1;
      }
      hit = 0;
    }
    if (n == buf._124_4_) {
      if ((*(char *)((long)&match + (long)hit) == '\r') ||
         (*(char *)((long)&match + (long)hit) == '\n')) {
        local_bc = 1;
LAB_00152ff1:
        close(__fd);
        return local_bc;
      }
      n = 0;
    }
    if (*(char *)((long)&match + (long)hit) == string[n]) {
      n = n + 1;
    }
    else {
      n = 0;
    }
    hit = hit + 1;
  } while( true );
}

Assistant:

static int
lws_find_string_in_file(const char *filename, const char *string, int stringlen)
{
	char buf[128];
	int fd, match = 0, pos = 0, n = 0, hit = 0;

	fd = lws_open(filename, O_RDONLY);
	if (fd < 0) {
		lwsl_err("can't open auth file: %s\n", filename);
		return 0;
	}

	while (1) {
		if (pos == n) {
			n = read(fd, buf, sizeof(buf));
			if (n <= 0) {
				if (match == stringlen)
					hit = 1;
				break;
			}
			pos = 0;
		}

		if (match == stringlen) {
			if (buf[pos] == '\r' || buf[pos] == '\n') {
				hit = 1;
				break;
			}
			match = 0;
		}

		if (buf[pos] == string[match])
			match++;
		else
			match = 0;

		pos++;
	}

	close(fd);

	return hit;
}